

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WriteValue<duckdb::LogicalType>
          (Serializer *this,vector<duckdb::LogicalType,_true> *vec)

{
  pointer pLVar1;
  long lVar2;
  LogicalType *item;
  pointer value;
  
  lVar2 = (long)(vec->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(vec->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (*this->_vptr_Serializer[8])(this,lVar2 / 0x18,lVar2 % 0x18);
  pLVar1 = (vec->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (value = (vec->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start; value != pLVar1; value = value + 1) {
    WriteValue<duckdb::LogicalType>(this,value);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}